

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

FUNCTION_RETURN
generate_pc_id(PcIdentifier *identifiers,uint *array_size,IDENTIFICATION_STRATEGY strategy)

{
  uint uVar1;
  FUNCTION_RETURN FVar2;
  FUNCTION_RETURN FVar3;
  OsAdapterInfo *adapterInfos;
  DiskInfo *diskInfos;
  ulong uVar4;
  ulong uVar5;
  PcIdentifier *pauVar6;
  _Bool use_label;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  size_t adapter_num;
  int local_60;
  uint local_5c;
  ulong local_58;
  OsAdapterInfo *local_50;
  ulong local_48;
  DiskInfo *local_40;
  uchar *local_38;
  
  if (DISK_LABEL < strategy) {
    return FUNC_RET_ERROR;
  }
  uVar11 = (ulong)*array_size;
  switch(strategy) {
  case DEFAULT:
    if (*array_size == 0 || identifiers == (PcIdentifier *)0x0) {
      FVar3 = getAdapterInfos((OsAdapterInfo *)0x0,&adapter_num);
      if ((FVar3 != FUNC_RET_OK) || (adapter_num == 0)) goto switchD_002d1b27_caseD_3;
      FVar3 = FUNC_RET_OK;
      FVar2 = getDiskInfos((DiskInfo *)0x0,&local_48);
      if (local_48 != 0 && FVar2 == FUNC_RET_OK) {
        *array_size = (int)local_48 * (int)adapter_num;
        break;
      }
    }
    else {
      adapterInfos = (OsAdapterInfo *)malloc(uVar11 * 0x414);
      adapter_num = uVar11;
      FVar3 = getAdapterInfos(adapterInfos,&adapter_num);
      if ((FVar3 != FUNC_RET_OK) && (FVar3 != FUNC_RET_BUFFER_TOO_SMALL)) {
        free(adapterInfos);
        goto switchD_002d1b27_caseD_3;
      }
      uVar1 = *array_size;
      diskInfos = (DiskInfo *)malloc((ulong)uVar1 * 0x20c);
      local_48 = (ulong)uVar1;
      FVar3 = getDiskInfos(diskInfos,&local_48);
      if ((FVar3 == FUNC_RET_OK) || (FVar3 == FUNC_RET_BUFFER_TOO_SMALL)) {
        uVar1 = *array_size;
        local_38 = diskInfos->disk_sn + 2;
        FVar3 = FUNC_RET_OK;
        local_58 = local_48;
        uVar5 = 0;
        uVar8 = 0;
        while (iVar9 = (int)uVar5, uVar5 < local_48) {
          pauVar6 = identifiers + uVar8;
          for (uVar10 = 0; local_60 = iVar9, local_5c = uVar8, uVar10 < adapter_num;
              uVar10 = uVar10 + 1) {
            if (uVar1 <= uVar10 + iVar9 * (int)adapter_num) {
              FVar3 = FUNC_RET_BUFFER_TOO_SMALL;
              goto LAB_002d1cea;
            }
            for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
              (*pauVar6)[lVar7] =
                   adapterInfos[uVar10].mac_address[lVar7 + 2] ^ local_38[lVar7 + uVar5 * 0x20c];
            }
            pauVar6 = pauVar6 + 1;
          }
          uVar8 = uVar8 + (int)adapter_num;
          uVar5 = (ulong)(iVar9 + 1);
        }
LAB_002d1cea:
        uVar5 = adapter_num * local_48;
        if ((ulong)*array_size <= adapter_num * local_48) {
          uVar5 = (ulong)*array_size;
        }
        *array_size = (uint)uVar5;
        local_50 = adapterInfos;
        local_40 = diskInfos;
        free(diskInfos);
        free(adapterInfos);
        break;
      }
      free(diskInfos);
      free(adapterInfos);
    }
  case ETHERNET:
    iVar9 = 1;
LAB_002d1d3f:
    FVar3 = generate_ethernet_pc_id(identifiers,array_size,iVar9);
    break;
  case IP_ADDRESS:
    iVar9 = 0;
    goto LAB_002d1d3f;
  case DISK_NUM:
switchD_002d1b27_caseD_3:
    use_label = false;
    goto LAB_002d1d1f;
  case DISK_LABEL:
    use_label = true;
LAB_002d1d1f:
    FVar3 = generate_disk_pc_id(identifiers,array_size,use_label);
  }
  if ((identifiers != (PcIdentifier *)0x0) && (FVar3 == FUNC_RET_OK)) {
    pauVar6 = identifiers;
    for (uVar5 = 0; uVar4 = (ulong)*array_size, uVar5 < uVar4; uVar5 = uVar5 + 1) {
      (*pauVar6)[0] = (*pauVar6)[0] & 0xf | (char)strategy << 5;
      pauVar6 = pauVar6 + 1;
    }
    pauVar6 = identifiers + uVar4;
    for (; uVar4 < uVar11; uVar4 = uVar4 + 1) {
      identifiers[uVar4][0] = 0xc0;
      for (lVar7 = 1; lVar7 != 6; lVar7 = lVar7 + 1) {
        (*pauVar6)[lVar7] = '*';
      }
      pauVar6 = pauVar6 + 1;
    }
    FVar3 = FUNC_RET_OK;
  }
  return FVar3;
}

Assistant:

FUNCTION_RETURN generate_pc_id(PcIdentifier * identifiers,
		unsigned int * array_size, IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	unsigned int i, j;
	const unsigned int original_array_size = *array_size;
	unsigned char strategy_num;
	switch (strategy) {
	case DEFAULT:
		result = generate_default_pc_id(identifiers, array_size);
		break;
	case ETHERNET:
		result = generate_ethernet_pc_id(identifiers, array_size, true);
		break;
	case IP_ADDRESS:
		result = generate_ethernet_pc_id(identifiers, array_size, false);
		break;
	case DISK_NUM:
		result = generate_disk_pc_id(identifiers, array_size, false);
		break;
	case DISK_LABEL:
		result = generate_disk_pc_id(identifiers, array_size, true);
		break;
	default:
		return FUNC_RET_ERROR;
	}

	if (result == FUNC_RET_OK && identifiers != NULL) {
		strategy_num = strategy << 5;
		for (i = 0; i < *array_size; i++) {
			//encode strategy in the first three bits of the pc_identifier
			identifiers[i][0] = (identifiers[i][0] & 15) | strategy_num;
		}
		//fill array if larger
		for (i = *array_size; i < original_array_size; i++) {
			identifiers[i][0] = STRATEGY_UNKNOWN << 5;
			for (j = 1; j < sizeof(PcIdentifier); j++) {
				identifiers[i][j] = 42; //padding
			}
		}
	}
	return result;
}